

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

uint * __thiscall r_code::vector<unsigned_int>::operator[](vector<unsigned_int> *this,size_t i)

{
  reference pvVar1;
  
  if ((ulong)((long)(this->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) <= i) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->m_vector,i + 1);
  }
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&this->m_vector,i);
  return pvVar1;
}

Assistant:

T &operator [](size_t i)
    {
        if (i >= size()) {
            m_vector.resize(i + 1);
        }

        return m_vector.at(i);
    }